

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-list.c
# Opt level: O3

monster_list_t * monster_list_new(void)

{
  wchar_t wVar1;
  monster_list_t *p;
  monster_list_entry_t *pmVar2;
  
  p = (monster_list_t *)mem_zalloc(0x28);
  wVar1 = cave_monster_max(cave);
  if (p != (monster_list_t *)0x0) {
    pmVar2 = (monster_list_entry_t *)mem_zalloc((long)wVar1 << 5);
    p->entries = pmVar2;
    if (pmVar2 != (monster_list_entry_t *)0x0) {
      p->entries_size = (long)wVar1;
      return p;
    }
    mem_free(p);
  }
  return (monster_list_t *)0x0;
}

Assistant:

monster_list_t *monster_list_new(void)
{
	monster_list_t *list = mem_zalloc(sizeof(monster_list_t));
	size_t size = cave_monster_max(cave);

	if (list == NULL)
		return NULL;

	list->entries = mem_zalloc(size * sizeof(monster_list_entry_t));

	if (list->entries == NULL) {
		mem_free(list);
		return NULL;
	}

	list->entries_size = size;

	return list;
}